

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int str_utf8_decode(char **ptr)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  
  pcVar4 = *ptr;
  uVar7 = (uint)*pcVar4;
  if (*pcVar4 < '\0') {
    if ((uVar7 & 0xe0) == 0xc0) {
      pcVar6 = pcVar4 + 1;
      bVar1 = pcVar4[1];
      uVar5 = 0xffffffff;
      if ((bVar1 != 0) && ((bVar1 & 0xffffffc0) == 0x80)) {
        uVar7 = (uVar7 & 0x1f) << 6;
        pcVar6 = pcVar4 + 2;
        uVar5 = 0xffffffff;
        if (0x7f < uVar7) {
          uVar5 = bVar1 & 0x3f | uVar7;
        }
      }
    }
    else if ((uVar7 & 0xf0) == 0xe0) {
      pcVar6 = pcVar4 + 1;
      cVar2 = pcVar4[1];
      uVar5 = 0xffffffff;
      if ((cVar2 != '\0') && (((int)cVar2 & 0xc0U) == 0x80)) {
        pcVar6 = pcVar4 + 2;
        bVar1 = pcVar4[2];
        if ((bVar1 != 0) && ((bVar1 & 0xffffffc0) == 0x80)) {
          uVar7 = ((int)cVar2 & 0x3fU) << 6 | (uVar7 & 0xf) << 0xc;
          pcVar6 = pcVar4 + 3;
          uVar5 = 0xffffffff;
          if (0x7ff < uVar7) {
            uVar5 = bVar1 & 0x3f | uVar7;
          }
        }
      }
    }
    else {
      pcVar6 = pcVar4 + 1;
      uVar5 = 0xffffffff;
      if ((((uVar7 & 0xf8) == 0xf0) && (cVar2 = *pcVar6, cVar2 != '\0')) &&
         (((int)cVar2 & 0xc0U) == 0x80)) {
        pcVar6 = pcVar4 + 2;
        cVar3 = pcVar4[2];
        if ((cVar3 != '\0') && (((int)cVar3 & 0xc0U) == 0x80)) {
          pcVar6 = pcVar4 + 3;
          bVar1 = pcVar4[3];
          if ((bVar1 != 0) && ((bVar1 & 0xffffffc0) == 0x80)) {
            uVar7 = ((int)cVar2 & 0x3fU) << 0xc | (uVar7 & 7) << 0x12;
            pcVar6 = pcVar4 + 4;
            uVar5 = 0xffffffff;
            if (0xffefffff < uVar7 - 0x110000) {
              uVar5 = bVar1 & 0x3f | ((int)cVar3 & 0x3fU) << 6 | uVar7;
            }
          }
        }
      }
    }
  }
  else {
    pcVar6 = pcVar4 + 1;
    uVar5 = uVar7;
  }
  *ptr = pcVar6;
  return uVar5;
}

Assistant:

int str_utf8_decode(const char **ptr)
{
	const char *buf = *ptr;
	int ch = 0;

	do
	{
		if((*buf&0x80) == 0x0)  /* 0xxxxxxx */
		{
			ch = *buf;
			buf++;
		}
		else if((*buf&0xE0) == 0xC0) /* 110xxxxx */
		{
			ch  = (*buf++ & 0x3F) << 6; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F);
			if(ch < 0x80 || ch > 0x7FF) ch = -1;
		}
		else  if((*buf & 0xF0) == 0xE0)	/* 1110xxxx */
		{
			ch  = (*buf++ & 0x1F) << 12; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F) <<  6; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F);
			if(ch < 0x800 || ch > 0xFFFF) ch = -1;
		}
		else if((*buf & 0xF8) == 0xF0)	/* 11110xxx */
		{
			ch  = (*buf++ & 0x0F) << 18; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F) << 12; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F) <<  6; if(!(*buf) || (*buf&0xC0) != 0x80) break;
			ch += (*buf++ & 0x3F);
			if(ch < 0x10000 || ch > 0x10FFFF) ch = -1;
		}
		else
		{
			/* invalid */
			buf++;
			break;
		}

		*ptr = buf;
		return ch;
	} while(0);

	/* out of bounds */
	*ptr = buf;
	return -1;

}